

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChVariablesNode.cpp
# Opt level: O2

void __thiscall
chrono::ChVariablesNode::Compute_inc_invMb_v
          (ChVariablesNode *this,ChVectorRef *result,ChVectorConstRef vect)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  long lVar4;
  uint __line;
  int iVar5;
  Scalar *pSVar6;
  char *__assertion;
  CoeffReturnType CVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  
  lVar4 = (vect->
          super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
          ).
          super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
          .m_rows.m_value;
  iVar5 = (*(this->super_ChVariables)._vptr_ChVariables[2])();
  if (lVar4 == iVar5) {
    lVar4 = *(long *)&(result->
                      super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                      ).field_0x8;
    iVar5 = (*(this->super_ChVariables)._vptr_ChVariables[2])(this);
    if (lVar4 == iVar5) {
      auVar8._0_8_ = 1.0 / this->mass;
      CVar7 = Eigen::
              DenseCoeffsBase<Eigen::Ref<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
              ::operator()((DenseCoeffsBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
                            *)vect,0);
      pSVar6 = Eigen::
               DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_1>
               ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_1>
                             *)result,0);
      auVar8._8_8_ = 0;
      auVar11._8_8_ = 0;
      auVar11._0_8_ = CVar7;
      auVar1._8_8_ = 0;
      auVar1._0_8_ = *pSVar6;
      auVar1 = vfmadd213sd_fma(auVar11,auVar8,auVar1);
      *pSVar6 = auVar1._0_8_;
      CVar7 = Eigen::
              DenseCoeffsBase<Eigen::Ref<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
              ::operator()((DenseCoeffsBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
                            *)vect,1);
      pSVar6 = Eigen::
               DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_1>
               ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_1>
                             *)result,1);
      auVar9._8_8_ = 0;
      auVar9._0_8_ = auVar8._0_8_;
      auVar12._8_8_ = 0;
      auVar12._0_8_ = CVar7;
      auVar2._8_8_ = 0;
      auVar2._0_8_ = *pSVar6;
      auVar1 = vfmadd213sd_fma(auVar12,auVar9,auVar2);
      *pSVar6 = auVar1._0_8_;
      CVar7 = Eigen::
              DenseCoeffsBase<Eigen::Ref<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
              ::operator()((DenseCoeffsBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
                            *)vect,2);
      pSVar6 = Eigen::
               DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_1>
               ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_1>
                             *)result,2);
      auVar10._8_8_ = 0;
      auVar10._0_8_ = auVar8._0_8_;
      auVar13._8_8_ = 0;
      auVar13._0_8_ = CVar7;
      auVar3._8_8_ = 0;
      auVar3._0_8_ = *pSVar6;
      auVar1 = vfmadd213sd_fma(auVar13,auVar10,auVar3);
      *pSVar6 = auVar1._0_8_;
      return;
    }
    __assertion = "result.size() == Get_ndof()";
    __line = 0x35;
  }
  else {
    __assertion = "vect.size() == Get_ndof()";
    __line = 0x34;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/solver/ChVariablesNode.cpp"
                ,__line,
                "virtual void chrono::ChVariablesNode::Compute_inc_invMb_v(ChVectorRef, ChVectorConstRef) const"
               );
}

Assistant:

void ChVariablesNode::Compute_inc_invMb_v(ChVectorRef result, ChVectorConstRef vect) const {
    assert(vect.size() == Get_ndof());
    assert(result.size() == Get_ndof());

    // optimized unrolled operations
    double inv_mass = 1.0 / mass;
    result(0) += inv_mass * vect(0);
    result(1) += inv_mass * vect(1);
    result(2) += inv_mass * vect(2);
}